

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O3

void multiply(float *a,float *b)

{
  div_t dVar1;
  long lVar2;
  int i;
  long lVar3;
  float fVar4;
  float m [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  lVar3 = 0;
  do {
    dVar1 = div((int)lVar3,4);
    fVar4 = 0.0;
    lVar2 = 0;
    do {
      fVar4 = fVar4 + a[((long)dVar1 >> 0x20) + lVar2] *
                      *(float *)((long)b + lVar2 + (long)(dVar1.quot * 4) * 4);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x10);
    *(float *)((long)&local_58 + lVar3 * 4) = fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  *(undefined8 *)(a + 0xc) = local_28;
  *(undefined8 *)(a + 0xe) = uStack_20;
  *(undefined8 *)(a + 8) = local_38;
  *(undefined8 *)(a + 10) = uStack_30;
  *(undefined8 *)(a + 4) = local_48;
  *(undefined8 *)(a + 6) = uStack_40;
  *(undefined8 *)a = local_58;
  *(undefined8 *)(a + 2) = uStack_50;
  return;
}

Assistant:

static void multiply(float *a, const float *b)
{
  float m[16];
  int i, j;
  div_t d;

  for (i = 0; i < 16; i++) {
    m[i] = 0;
    d = div(i, 4);
    for (j = 0; j < 4; j++)
      m[i] += (a + d.rem)[j * 4] * (b + d.quot * 4)[j];
  }

  memcpy(a, m, sizeof(m));
}